

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMLSParserImpl::startEntityReference(DOMLSParserImpl *this,XMLEntityDecl *entDecl)

{
  ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *this_00;
  DOMNode *pDVar1;
  ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher> *this_01;
  ValueHashTableBucketElem<bool> *pVVar2;
  ValueHashTableBucketElem<xercesc_4_0::DOMLSParserFilter::FilterAction> *pVVar3;
  FilterAction *pFVar4;
  XMLSize_t hashVal;
  FilterAction local_24;
  XMLSize_t local_20;
  
  if ((((this->super_AbstractDOMParser).fCreateEntityReferenceNodes == true) &&
      (this->fFilter != (DOMLSParserFilter *)0x0)) &&
     (this_00 = this->fFilterDelayedTextNodes,
     this_00 != (ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *)0x0)) {
    pDVar1 = (this->super_AbstractDOMParser).fCurrentNode;
    for (pVVar2 = this_00->fBucketList[(ulong)pDVar1 % this_00->fHashModulus];
        pVVar2 != (ValueHashTableBucketElem<bool> *)0x0; pVVar2 = pVVar2->fNext) {
      if ((DOMNode *)pVVar2->fKey == pDVar1) {
        ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::removeBucketElem(this_00,pDVar1,&local_20);
        applyFilter(this,(this->super_AbstractDOMParser).fCurrentNode);
        break;
      }
    }
  }
  pDVar1 = (this->super_AbstractDOMParser).fCurrentParent;
  AbstractDOMParser::startEntityReference(&this->super_AbstractDOMParser,entDecl);
  if ((((this->super_AbstractDOMParser).fCreateEntityReferenceNodes == true) &&
      (this->fFilter != (DOMLSParserFilter *)0x0)) &&
     (this_01 = this->fFilterAction,
     this_01 !=
     (ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher> *)0x0))
  {
    for (pVVar3 = this_01->fBucketList[(ulong)pDVar1 % this_01->fHashModulus];
        pVVar3 != (ValueHashTableBucketElem<xercesc_4_0::DOMLSParserFilter::FilterAction> *)0x0;
        pVVar3 = pVVar3->fNext) {
      if ((DOMNode *)pVVar3->fKey == pDVar1) {
        pFVar4 = ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>
                 ::get(this_01,pDVar1,XMLPlatformUtils::fgMemoryManager);
        if (*pFVar4 != FILTER_REJECT) {
          return;
        }
        local_24 = FILTER_REJECT;
        ValueHashTableOf<xercesc_4_0::DOMLSParserFilter::FilterAction,_xercesc_4_0::PtrHasher>::put
                  (this->fFilterAction,(this->super_AbstractDOMParser).fCurrentNode,&local_24);
        return;
      }
    }
  }
  return;
}

Assistant:

void DOMLSParserImpl::startEntityReference(const XMLEntityDecl& entDecl)
{
    if(fCreateEntityReferenceNodes && fFilter)
    {
        // send the notification for the previous text node
        if(fFilterDelayedTextNodes && fFilterDelayedTextNodes->containsKey(fCurrentNode))
        {
            fFilterDelayedTextNodes->removeKey(fCurrentNode);
            applyFilter(fCurrentNode);
        }
    }

    DOMNode* origParent = fCurrentParent;
    AbstractDOMParser::startEntityReference(entDecl);
    if (fCreateEntityReferenceNodes && fFilter)
    {
        if(fFilterAction && fFilterAction->containsKey(origParent) && fFilterAction->get(origParent)==DOMLSParserFilter::FILTER_REJECT)
            fFilterAction->put(fCurrentNode, DOMLSParserFilter::FILTER_REJECT);
    }
}